

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

StringPtr kj::operator*(ulong param_1)

{
  char *__s;
  size_t sVar1;
  StringPtr SVar2;
  
  __s = operator*::SEVERITY_STRINGS[param_1 & 0xffffffff];
  sVar1 = strlen(__s);
  SVar2.content.size_ = sVar1 + 1;
  SVar2.content.ptr = __s;
  return (StringPtr)SVar2.content;
}

Assistant:

StringPtr KJ_STRINGIFY(LogSeverity severity) {
  static const char* SEVERITY_STRINGS[] = {
    "info",
    "warning",
    "error",
    "fatal",
    "debug"
  };

  return SEVERITY_STRINGS[static_cast<uint>(severity)];
}